

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::IFF_PDU::Decode(IFF_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT16 KVar3;
  SystemType SVar4;
  IFF_Layer3Transponder *this_00;
  KException *pKVar5;
  undefined7 in_register_00000011;
  int iVar6;
  allocator<char> local_71;
  KString local_70;
  LayerHeader hdr;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar6 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar6 = 0;
  }
  if (iVar6 + (uint)KVar2 < 0x3c) {
    pKVar5 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Decode",(allocator<char> *)&hdr);
    KException::KException(pKVar5,&local_70,2);
    __cxa_throw(pKVar5,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  KVar2 = KDataStream::GetBufferSize(stream);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EventID,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
  (*(this->m_SystemID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_SystemID,stream);
  KDataStream::Read(stream,&this->m_ui8SystemDesignator);
  KDataStream::Read(stream,&this->m_ui8SystemSpecific);
  (*(this->m_FOD).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_FOD,stream);
  iVar6 = *(int *)&(this->super_Header).super_Header6.m_ui16PDULength;
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar6 = (iVar6 - (uint)KVar2) + (uint)KVar3 + -0xc;
  do {
    if ((short)iVar6 == 0) {
      return;
    }
    DATA_TYPE::LayerHeader::LayerHeader(&hdr,stream);
    KVar1 = DATA_TYPE::LayerHeader::GetLayerNumber(&hdr);
    if (KVar1 == '\x02') {
      this_00 = (IFF_Layer3Transponder *)operator_new(0x58);
      DATA_TYPE::IFF_Layer2::IFF_Layer2((IFF_Layer2 *)this_00,&hdr,stream);
    }
    else {
      if (KVar1 != '\x03') {
        pKVar5 = (KException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Decode",&local_71);
        KVar1 = DATA_TYPE::LayerHeader::GetLayerNumber(&hdr);
        KException::KException<unsigned_char>(pKVar5,&local_70,9,KVar1);
        __cxa_throw(pKVar5,&KException::typeinfo,KException::~KException);
      }
      SVar4 = DATA_TYPE::SystemIdentifier::GetSystemType(&this->m_SystemID);
      if (RRB_Transponder < SVar4) {
LAB_0026d6d7:
        pKVar5 = (KException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Decode",&local_71);
        KException::KException<char_const*>(pKVar5,&local_70,10,"Layer is null");
        __cxa_throw(pKVar5,&KException::typeinfo,KException::~KException);
      }
      if ((0x2aU >> (SVar4 & 0x1f) & 1) == 0) {
        if ((0x14U >> (SVar4 & 0x1f) & 1) == 0) goto LAB_0026d6d7;
        this_00 = (IFF_Layer3Transponder *)operator_new(0x78);
        DATA_TYPE::IFF_Layer3Interrogator::IFF_Layer3Interrogator
                  ((IFF_Layer3Interrogator *)this_00,&hdr,stream);
      }
      else {
        this_00 = (IFF_Layer3Transponder *)operator_new(0x90);
        DATA_TYPE::IFF_Layer3Transponder::IFF_Layer3Transponder(this_00,&hdr,stream);
      }
    }
    local_70._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00334378;
    local_70._M_string_length = (size_type)this_00;
    local_70.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_70.field_2._M_allocated_capacity = 1;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>>
    ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>
              ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>>
                *)&this->m_vLayers,(KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)&local_70);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)&local_70);
    KVar2 = DATA_TYPE::LayerHeader::GetLayerLength((LayerHeader *)this_00);
    iVar6 = iVar6 - (uint)KVar2;
    DATA_TYPE::LayerHeader::~LayerHeader(&hdr);
  } while( true );
}

Assistant:

void IFF_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IFF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

	// Record the size of the stream so we can calculate how much data is left. We could just use 
	// stream.GetBufferSize() but what if this PDU was part of a PDU bundle...
	KUINT32 streamSizeSnapshot = stream.GetBufferSize();

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_Location
           >> KDIS_STREAM m_SystemID
           >> m_ui8SystemDesignator
		   >> m_ui8SystemSpecific
           >> KDIS_STREAM m_FOD;
	
	KUINT16 remainingData = m_ui16PDULength - HEADER6_PDU_SIZE - ( streamSizeSnapshot - stream.GetBufferSize() );
	
	// Decode each layer
	while( remainingData )
	{
		LayerHeader hdr( stream );
		LayerHeader * layer = NULL;

		switch ( hdr.GetLayerNumber() )
		{
			case 2: layer = new IFF_Layer2( hdr, stream ); break;

			#if DIS_VERSION > 6
			case 3: 
				switch( m_SystemID.GetSystemType() )
				{
					case Mark_X_XII_ATCRBS_ModeS_Transponder:
					case RRB_Transponder:
					case Soviet_Transponder:
						layer = new IFF_Layer3Transponder( hdr, stream );
						break;

					case Mark_X_XII_ATCRBS_ModeS_Interrogator:
					case Soviet_Interrogator:
						layer = new IFF_Layer3Interrogator( hdr, stream );
						break;
				}							
				break;
			#endif
			
			//case 4: layer = new IFF_Layer4( hdr, stream ); break;
			//case 5: layer = new IFF_Layer5( hdr, stream ); break;
				
			default: throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, hdr.GetLayerNumber() );						
		}

		if( layer )
		{
			m_vLayers.push_back( layer );
			remainingData -= layer->GetLayerLength();
		}
		else
		{
			throw KException( __FUNCTION__, INVALID_OPERATION, "Layer is null" );
		}
	}
}